

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::relu_gradient(tensor *grad,tensor *dest,tensor *gradient_input)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar6;
  undefined4 uVar7;
  long lVar5;
  
  iVar2 = (*gradient_input->_vptr_tensor[2])(gradient_input);
  iVar3 = (*dest->_vptr_tensor[2])(dest);
  iVar4 = (*grad->_vptr_tensor[3])(grad);
  lVar5 = CONCAT44(extraout_var_01,iVar4);
  lVar1 = dest->m_size;
  if (grad == gradient_input) {
    if (lVar1 != 0) {
      lVar6 = 0;
      do {
        uVar7 = 0;
        if (0.0 < *(float *)(CONCAT44(extraout_var_00,iVar3) + lVar6 * 4)) {
          uVar7 = *(undefined4 *)(CONCAT44(extraout_var,iVar2) + lVar6 * 4);
        }
        *(undefined4 *)(lVar5 + lVar6 * 4) = uVar7;
        lVar6 = lVar6 + 1;
      } while (lVar1 != lVar6);
    }
  }
  else if (lVar1 != 0) {
    lVar6 = 0;
    do {
      if (0.0 < *(float *)(CONCAT44(extraout_var_00,iVar3) + lVar6 * 4)) {
        *(float *)(lVar5 + lVar6 * 4) =
             *(float *)(CONCAT44(extraout_var,iVar2) + lVar6 * 4) + *(float *)(lVar5 + lVar6 * 4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar1 != lVar6);
  }
  return;
}

Assistant:

void relu_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input
        )
        {
            const float* gi = gradient_input.host();
            const float* in = dest.host();
            float* out = grad.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] = gi[i];
                    else
                        out[i] = 0;
                }
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] += gi[i];
                }
            }
        }